

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.hpp
# Opt level: O1

void __thiscall
duckdb::AlterInfo::AlterInfo
          (AlterInfo *this,AlterType type,string *catalog_p,string *schema_p,string *name_p,
          OnEntryNotFound if_not_found)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_ParseInfo).info_type = ALTER_INFO;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__AlterTableInfo_0247d2a8;
  (this->super_ParseInfo).field_0x9 = type;
  (this->super_ParseInfo).field_0xa = if_not_found;
  paVar1 = &(this->catalog).field_2;
  (this->catalog)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (catalog_p->_M_dataplus)._M_p;
  paVar2 = &catalog_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&catalog_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->catalog).field_2 + 8) = uVar4;
  }
  else {
    (this->catalog)._M_dataplus._M_p = pcVar3;
    (this->catalog).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->catalog)._M_string_length = catalog_p->_M_string_length;
  (catalog_p->_M_dataplus)._M_p = (pointer)paVar2;
  catalog_p->_M_string_length = 0;
  (catalog_p->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->schema).field_2;
  (this->schema)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (schema_p->_M_dataplus)._M_p;
  paVar2 = &schema_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&schema_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->schema).field_2 + 8) = uVar4;
  }
  else {
    (this->schema)._M_dataplus._M_p = pcVar3;
    (this->schema).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->schema)._M_string_length = schema_p->_M_string_length;
  (schema_p->_M_dataplus)._M_p = (pointer)paVar2;
  schema_p->_M_string_length = 0;
  (schema_p->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name_p->_M_dataplus)._M_p;
  paVar2 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar2;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  this->allow_internal = false;
  return;
}

Assistant:

explicit ParseInfo(ParseInfoType info_type) : info_type(info_type) {
	}